

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::ParseDynamic
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,EncodedChar *body,EncodedChar *bodyLim
          ,EncodedChar *opts,EncodedChar *optsLim,RegexFlags *flags)

{
  RegexFlags RVar1;
  code *pcVar2;
  CharCount CVar3;
  CharCount CVar4;
  HRESULT HVar5;
  bool bVar6;
  byte bVar7;
  undefined4 *puVar8;
  Node *pNVar9;
  ParseError *pPVar10;
  
  if (body == (EncodedChar *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb01,"(body != 0)","body != 0");
    if (!bVar6) goto LAB_00ece59b;
    *puVar8 = 0;
  }
  if ((bodyLim < body) || (*bodyLim != '\0')) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb02,"(bodyLim >= body && *bodyLim == 0)",
                       "bodyLim >= body && *bodyLim == 0");
    if (!bVar6) goto LAB_00ece59b;
    *puVar8 = 0;
  }
  if ((opts != (EncodedChar *)0x0) && ((optsLim < opts || (*optsLim != '\0')))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xb03,"(opts == 0 || (optsLim >= opts && *optsLim == 0))",
                       "opts == 0 || (optsLim >= opts && *optsLim == 0)");
    if (!bVar6) goto LAB_00ece59b;
    *puVar8 = 0;
  }
  this->input = body;
  this->inputLim = bodyLim;
  this->next = body;
  this->inBody = true;
  (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = 0;
  this->positionAfterLastSurrogate = (EncodedChar *)0x0;
  this->deferredIfNotUnicodeError = (ParseError *)0x0;
  this->deferredIfUnicodeError = (ParseError *)0x0;
  DisjunctionPass0(this,0);
  if (this->next < this->inputLim) {
    Fail(this,-0x7ff5ec67);
  }
  if (opts == (EncodedChar *)0x0) {
    this->unicodeFlagPresent = false;
    this->caseInsensitiveFlagPresent = false;
    this->dotAllFlagPresent = false;
  }
  else {
    this->input = opts;
    this->inputLim = optsLim;
    this->next = opts;
    this->inBody = false;
    (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = 0;
    Options(this,flags);
    if (this->next < this->inputLim) {
      Fail(this,-0x7ff5ec67);
    }
    RVar1 = *flags;
    bVar7 = RVar1 >> 5 & 1;
    bVar6 = (bool)(RVar1 >> 3 & 1);
    this->unicodeFlagPresent = bVar6;
    this->caseInsensitiveFlagPresent = (bool)(RVar1 & IgnoreCaseRegexFlag);
    this->dotAllFlagPresent = (bool)bVar7;
    if ((bVar6 != false) && (((this->scriptContext->config).threadConfig)->m_ES6Unicode == false)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xb16,
                         "(!this->unicodeFlagPresent || scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())"
                         ,
                         "!this->unicodeFlagPresent || scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()"
                        );
      if (!bVar6) goto LAB_00ece59b;
      *puVar8 = 0;
      bVar7 = this->dotAllFlagPresent;
    }
    if (((bVar7 & 1) != 0) &&
       (((this->scriptContext->config).threadConfig)->m_ES2018RegExDotAll == false)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xb17,
                         "(!this->dotAllFlagPresent || scriptContext->GetConfig()->IsES2018RegExDotAllEnabled())"
                         ,
                         "!this->dotAllFlagPresent || scriptContext->GetConfig()->IsES2018RegExDotAllEnabled()"
                        );
      if (!bVar6) goto LAB_00ece59b;
      *puVar8 = 0;
    }
  }
  if ((this->deferredIfNotUnicodeError == (ParseError *)0x0) || (this->unicodeFlagPresent != false))
  {
    if ((this->deferredIfUnicodeError == (ParseError *)0x0) || (this->unicodeFlagPresent != true)) {
      this->currentSurrogatePairNode = this->surrogatePairList;
      this->input = body;
      this->inputLim = bodyLim;
      this->next = body;
      this->inBody = true;
      (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = 0;
      pNVar9 = DisjunctionPass1(this);
      if (this->next < this->inputLim) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xb2f,"(IsEOF())","IsEOF()");
        if (!bVar6) {
LAB_00ece59b:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
      return pNVar9;
    }
    puVar8 = (undefined4 *)__cxa_allocate_exception(0x10);
    pPVar10 = this->deferredIfUnicodeError;
  }
  else {
    puVar8 = (undefined4 *)__cxa_allocate_exception(0x10);
    pPVar10 = this->deferredIfNotUnicodeError;
  }
  CVar3 = pPVar10->pos;
  CVar4 = pPVar10->encodedPos;
  HVar5 = pPVar10->error;
  *puVar8 = *(undefined4 *)pPVar10;
  puVar8[1] = CVar3;
  puVar8[2] = CVar4;
  puVar8[3] = HVar5;
  __cxa_throw(puVar8,&ParseError::typeinfo,0);
}

Assistant:

Node* Parser<P, IsLiteral>::ParseDynamic
        ( const EncodedChar* body
        , const EncodedChar* bodyLim
        , const EncodedChar* opts
        , const EncodedChar* optsLim
        , RegexFlags& flags )
    {
        Assert(!IsLiteral);
        Assert(body != 0);
        Assert(bodyLim >= body && *bodyLim == 0);
        Assert(opts == 0 || (optsLim >= opts && *optsLim == 0));

        // Body, pass 0
        SetPosition(body, bodyLim, true);

        PatternPass0();
        if (!IsEOF())
            Fail(JSERR_RegExpSyntax);

        // Options
        if (opts != 0)
        {
            SetPosition(opts, optsLim, false);
            Options(flags);
            if (!IsEOF())
                Fail(JSERR_RegExpSyntax);
            this->unicodeFlagPresent = (flags & UnifiedRegex::UnicodeRegexFlag) == UnifiedRegex::UnicodeRegexFlag;
            this->caseInsensitiveFlagPresent = (flags & UnifiedRegex::IgnoreCaseRegexFlag) == UnifiedRegex::IgnoreCaseRegexFlag;
            this->dotAllFlagPresent = (flags & UnifiedRegex::DotAllRegexFlag) == UnifiedRegex::DotAllRegexFlag;
            Assert(!this->unicodeFlagPresent || scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());
            Assert(!this->dotAllFlagPresent || scriptContext->GetConfig()->IsES2018RegExDotAllEnabled());
        }
        else
        {
            this->unicodeFlagPresent = false;
            this->caseInsensitiveFlagPresent = false;
            this->dotAllFlagPresent = false;
        }

        // If this HR has been set, that means we have an earlier failure than the one caught above.
        if (this->deferredIfNotUnicodeError != nullptr && !this->unicodeFlagPresent)
        {
            throw ParseError(*deferredIfNotUnicodeError);
        }
        else if(this->deferredIfUnicodeError != nullptr && this->unicodeFlagPresent)
        {
            throw ParseError(*deferredIfUnicodeError);
        }

        this->currentSurrogatePairNode = this->surrogatePairList;

        // Body, pass 1
        SetPosition(body, bodyLim, true);
        Node* root = PatternPass1();
        Assert(IsEOF());


        return root;
    }